

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idasAkzoNob_ASAi_dns.c
# Opt level: O2

int main(void)

{
  undefined8 *puVar1;
  long *plVar2;
  int iVar3;
  undefined8 *userdata;
  N_Vector yy;
  N_Vector yd;
  N_Vector resval;
  long *returnvalue;
  void *returnvalue_00;
  undefined8 uVar4;
  int iVar5;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  int retval;
  int indexB;
  SUNContext ctx;
  long *local_88;
  long *local_80;
  void *local_78;
  void *local_70;
  void *local_68;
  void *local_60;
  sunrealtype time;
  long nst;
  void *local_48;
  int ncheck;
  long nstB;
  
  puts("\nAdjoint Sensitivity Example for Akzo-Nobel Chemical Kinetics");
  puts("-------------------------------------------------------------");
  puts("Sensitivity of G = int_t0^tf (y1) dt with respect to IC.");
  puts("-------------------------------------------------------------\n");
  retval = SUNContext_Create(0,&ctx);
  iVar5 = 1;
  iVar3 = check_retval(&retval,"SUNContext_Create",1);
  if (iVar3 == 0) {
    userdata = (undefined8 *)malloc(0x48);
    *userdata = 0x4032b33333333333;
    userdata[1] = 0x3fe28f5c28f5c28f;
    userdata[2] = 0x3fb70a3d70a3d70a;
    userdata[3] = 0x3fdae147ae147ae1;
    userdata[4] = 0x4041333333333333;
    userdata[5] = 0x400a666666666666;
    *(undefined4 *)(userdata + 6) = 0xb851eb85;
    *(undefined4 *)((long)userdata + 0x34) = 0x405cf51e;
    *(undefined4 *)(userdata + 7) = 0xcccccccd;
    *(undefined4 *)((long)userdata + 0x3c) = 0x3feccccc;
    userdata[8] = 0x4087080000000000;
    yy = (N_Vector)N_VNew_Serial(6,ctx);
    iVar3 = check_retval(yy,"N_VNew_Serial",0);
    if (iVar3 == 0) {
      yd = (N_Vector)N_VClone(yy);
      iVar3 = check_retval(yd,"N_VNew_Serial",0);
      if (iVar3 == 0) {
        puVar1 = *(undefined8 **)((long)yy->content + 0x10);
        *puVar1 = 0x3fdc6a7ef9db22d1;
        puVar1[1] = 0x3f5426fe718a86d7;
        *(undefined4 *)(puVar1 + 2) = 0;
        *(undefined4 *)((long)puVar1 + 0x14) = 0;
        *(undefined4 *)(puVar1 + 3) = 0x3126e979;
        *(undefined4 *)((long)puVar1 + 0x1c) = 0x3f7cac08;
        *(undefined4 *)(puVar1 + 4) = 0;
        *(undefined4 *)((long)puVar1 + 0x24) = 0;
        *(undefined4 *)(puVar1 + 5) = 0xee17cb23;
        *(undefined4 *)((long)puVar1 + 0x2c) = 0x3fd70a3b;
        N_VConst(0,yd);
        resval = (N_Vector)N_VClone(yy);
        res((sunrealtype)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da),yy,yd,resval,userdata);
        N_VScale(0,resval,yd);
        N_VDestroy(resval);
        returnvalue = (long *)N_VNew_Serial(1,ctx);
        iVar3 = check_retval(returnvalue,"N_VNew_Serial",0);
        if (iVar3 == 0) {
          **(undefined8 **)(*returnvalue + 0x10) = 0;
          returnvalue_00 = (void *)IDACreate(ctx);
          local_48 = returnvalue_00;
          iVar3 = check_retval(returnvalue_00,"IDACreate",0);
          if (iVar3 == 0) {
            retval = IDAInit(0,returnvalue_00,res,yy,yd);
            iVar5 = 1;
            iVar3 = check_retval(&retval,"IDAInit",1);
            if (iVar3 == 0) {
              retval = IDASStolerances(0xe2308c3a,0xd9d7bdbb,returnvalue_00);
              iVar5 = 1;
              iVar3 = check_retval(&retval,"IDASStolerances",1);
              if (iVar3 == 0) {
                retval = IDASetUserData(returnvalue_00,userdata);
                iVar5 = 1;
                iVar3 = check_retval(&retval,"IDASetUserData",1);
                if (iVar3 == 0) {
                  local_70 = (void *)SUNDenseMatrix(6,6,ctx);
                  iVar3 = check_retval(local_70,"SUNDenseMatrix",0);
                  if (iVar3 == 0) {
                    local_60 = (void *)SUNLinSol_Dense(yy,local_70,ctx);
                    iVar3 = check_retval(local_60,"SUNLinSol_Dense",0);
                    if (iVar3 == 0) {
                      retval = IDASetLinearSolver(returnvalue_00,local_60,local_70);
                      iVar5 = 1;
                      iVar3 = check_retval(&retval,"IDASetLinearSolver",1);
                      if (iVar3 == 0) {
                        retval = IDAQuadInit(returnvalue_00,rhsQ,returnvalue);
                        iVar5 = 1;
                        iVar3 = check_retval(&retval,"IDAQuadInit",1);
                        if (iVar3 == 0) {
                          retval = IDAQuadSStolerances(0xd9d7bdbb,0x812dea11,returnvalue_00);
                          iVar5 = 1;
                          iVar3 = check_retval(&retval,"IDAQuadSStolerances",1);
                          if (iVar3 == 0) {
                            iVar5 = 1;
                            retval = IDASetQuadErrCon(returnvalue_00,1);
                            iVar3 = check_retval(&retval,"IDASetQuadErrCon",1);
                            if (iVar3 == 0) {
                              iVar5 = 1;
                              retval = IDAAdjInit(returnvalue_00,0x96,1);
                              iVar3 = check_retval(&retval,"IDAAdjInit",1);
                              if (iVar3 == 0) {
                                printf("Forward integration ... ");
                                iVar5 = 1;
                                retval = IDASolveF(0,returnvalue_00,&time,yy,yd,1,&ncheck);
                                iVar3 = check_retval(&retval,"IDASolveF",1);
                                if (iVar3 == 0) {
                                  retval = IDAGetNumSteps(returnvalue_00,&nst);
                                  iVar5 = 1;
                                  iVar3 = check_retval(&retval,"IDAGetNumSteps",1);
                                  if (iVar3 == 0) {
                                    printf("done ( nst = %ld )\n",nst);
                                    retval = IDAGetQuad(returnvalue_00,&time,returnvalue);
                                    iVar5 = 1;
                                    iVar3 = check_retval(&retval,"IDAGetQuad",1);
                                    if (iVar3 == 0) {
                                      printf("G:          %24.16f \n",
                                             (int)**(undefined8 **)(*returnvalue + 0x10));
                                      puts(
                                          "--------------------------------------------------------\n"
                                          );
                                      local_88 = (long *)N_VClone(yy);
                                      iVar3 = check_retval(local_88,"N_VNew_Serial",0);
                                      if (iVar3 == 0) {
                                        N_VConst(0,local_88);
                                        local_80 = (long *)N_VClone(local_88);
                                        iVar3 = check_retval(local_80,"N_VNew_Serial",0);
                                        plVar2 = local_80;
                                        if (iVar3 == 0) {
                                          N_VConst(0,local_80);
                                          **(undefined8 **)(*plVar2 + 0x10) = 0xbff0000000000000;
                                          retval = IDACreateB(returnvalue_00,&indexB);
                                          iVar5 = 1;
                                          iVar3 = check_retval(&retval,"IDACreateB",1);
                                          if (iVar3 == 0) {
                                            retval = IDAInitB(0,returnvalue_00,indexB,resB,local_88,
                                                              local_80);
                                            iVar5 = 1;
                                            iVar3 = check_retval(&retval,"IDAInitB",1);
                                            if (iVar3 == 0) {
                                              retval = IDASStolerancesB(0xa0b5ed8d,0xe2308c3a,
                                                                        returnvalue_00,indexB);
                                              iVar5 = 1;
                                              iVar3 = check_retval(&retval,"IDASStolerancesB",1);
                                              if (iVar3 == 0) {
                                                retval = IDASetUserDataB(returnvalue_00,indexB,
                                                                         userdata);
                                                iVar5 = 1;
                                                iVar3 = check_retval(&retval,"IDASetUserDataB",1);
                                                if (iVar3 == 0) {
                                                  retval = IDASetMaxNumStepsB(returnvalue_00,indexB,
                                                                              1000);
                                                  local_78 = (void *)SUNDenseMatrix(6,6,ctx);
                                                  iVar3 = check_retval(local_78,"SUNDenseMatrix",0);
                                                  if (iVar3 == 0) {
                                                    local_68 = (void *)SUNLinSol_Dense(local_88,
                                                  local_78,ctx);
                                                  iVar3 = check_retval(local_68,"SUNLinSol_Dense",0)
                                                  ;
                                                  if (iVar3 == 0) {
                                                    retval = IDASetLinearSolverB(returnvalue_00,
                                                                                 indexB,local_68,
                                                                                 local_78);
                                                    iVar5 = 1;
                                                    iVar3 = check_retval(&retval,
                                                  "IDASetLinearSolverB",1);
                                                  if (iVar3 == 0) {
                                                    printf("Backward integration ... ");
                                                    iVar5 = 1;
                                                    retval = IDASolveB(0,returnvalue_00,1);
                                                    iVar3 = check_retval(&retval,"IDASolveB",1);
                                                    if (iVar3 == 0) {
                                                      uVar4 = IDAGetAdjIDABmem(returnvalue_00,indexB
                                                                              );
                                                      IDAGetNumSteps(uVar4,&nstB);
                                                      printf("done ( nst = %ld )\n",nstB);
                                                      retval = IDAGetB(returnvalue_00,indexB,&time,
                                                                       local_88,local_80);
                                                      iVar5 = 1;
                                                      iVar3 = check_retval(&retval,"IDAGetB",1);
                                                      plVar2 = local_88;
                                                      if (iVar3 == 0) {
                                                        puVar1 = *(undefined8 **)(*local_88 + 0x10);
                                                        printf(
                                                  "dG/dy0: \t%12.4e\n\t\t%12.4e\n\t\t%12.4e\n\t\t%12.4e\n\t\t%12.4e\n"
                                                  ,(int)*puVar1,(int)puVar1[1],puVar1[2],puVar1[3],
                                                  puVar1[4]);
                                                  puts(
                                                  "--------------------------------------------------------\n"
                                                  );
                                                  IDAFree(&local_48);
                                                  SUNLinSolFree(local_60);
                                                  SUNMatDestroy(local_70);
                                                  SUNLinSolFree(local_68);
                                                  SUNMatDestroy(local_78);
                                                  N_VDestroy(yy);
                                                  N_VDestroy(yd);
                                                  N_VDestroy(plVar2);
                                                  N_VDestroy(local_80);
                                                  N_VDestroy(returnvalue);
                                                  free(userdata);
                                                  SUNContext_Free(&ctx);
                                                  iVar5 = 0;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return iVar5;
}

Assistant:

int main(void)
{
  UserData data;
  void* mem;
  N_Vector yy, yp, rr, q;
  N_Vector yB, ypB;
  int ncheck, retval;
  sunrealtype time;
  long int nst, nstB;
  int indexB;
  SUNMatrix A, AB;
  SUNLinearSolver LS, LSB;
  SUNContext ctx;

  /* Consistent IC for  y, y'. */
  const sunrealtype y01 = SUN_RCONST(0.444);
  const sunrealtype y02 = SUN_RCONST(0.00123);
  const sunrealtype y03 = SUN_RCONST(0.0);
  const sunrealtype y04 = SUN_RCONST(0.007);
  const sunrealtype y05 = SUN_RCONST(0.0);

  mem = NULL;
  yy = yp = NULL;
  A = AB = NULL;
  LS = LSB = NULL;

  printf("\nAdjoint Sensitivity Example for Akzo-Nobel Chemical Kinetics\n");
  printf("-------------------------------------------------------------\n");
  printf("Sensitivity of G = int_t0^tf (y1) dt with respect to IC.\n");
  printf("-------------------------------------------------------------\n\n");

  /* Create the SUNDIALS context object for this simulation */
  retval = SUNContext_Create(SUN_COMM_NULL, &ctx);
  if (check_retval(&retval, "SUNContext_Create", 1)) { return 1; }

  /* Allocate user data. */
  data = (UserData)malloc(sizeof(*data));

  /* Fill user's data with the appropriate values for coefficients. */
  data->k1   = SUN_RCONST(18.7);
  data->k2   = SUN_RCONST(0.58);
  data->k3   = SUN_RCONST(0.09);
  data->k4   = SUN_RCONST(0.42);
  data->K    = SUN_RCONST(34.4);
  data->klA  = SUN_RCONST(3.3);
  data->Ks   = SUN_RCONST(115.83);
  data->pCO2 = SUN_RCONST(0.9);
  data->H    = SUN_RCONST(737.0);

  /* Allocate N-vectors. */
  yy = N_VNew_Serial(NEQ, ctx);
  if (check_retval((void*)yy, "N_VNew_Serial", 0)) { return (1); }
  yp = N_VClone(yy);
  if (check_retval((void*)yp, "N_VNew_Serial", 0)) { return (1); }

  /* Set IC */
  Ith(yy, 1) = y01;
  Ith(yy, 2) = y02;
  Ith(yy, 3) = y03;
  Ith(yy, 4) = y04;
  Ith(yy, 5) = y05;
  Ith(yy, 6) = data->Ks * y01 * y04;

  /* Get y' = - res(t0, y, 0) */
  N_VConst(ZERO, yp);

  rr = N_VClone(yy);
  res(T0, yy, yp, rr, data);
  N_VScale(-ONE, rr, yp);
  N_VDestroy(rr);

  /* Create and initialize q0 for quadratures. */
  q = N_VNew_Serial(1, ctx);
  if (check_retval((void*)q, "N_VNew_Serial", 0)) { return (1); }
  Ith(q, 1) = ZERO;

  /* Call IDACreate and IDAInit to initialize IDA memory */
  mem = IDACreate(ctx);
  if (check_retval((void*)mem, "IDACreate", 0)) { return (1); }

  retval = IDAInit(mem, res, T0, yy, yp);
  if (check_retval(&retval, "IDAInit", 1)) { return (1); }

  /* Set tolerances. */
  retval = IDASStolerances(mem, RTOL, ATOL);
  if (check_retval(&retval, "IDASStolerances", 1)) { return (1); }

  /* Attach user data. */
  retval = IDASetUserData(mem, data);
  if (check_retval(&retval, "IDASetUserData", 1)) { return (1); }

  /* Create dense SUNMatrix for use in linear solves */
  A = SUNDenseMatrix(NEQ, NEQ, ctx);
  if (check_retval((void*)A, "SUNDenseMatrix", 0)) { return (1); }

  /* Create dense SUNLinearSolver object */
  LS = SUNLinSol_Dense(yy, A, ctx);
  if (check_retval((void*)LS, "SUNLinSol_Dense", 0)) { return (1); }

  /* Attach the matrix and linear solver */
  retval = IDASetLinearSolver(mem, LS, A);
  if (check_retval(&retval, "IDASetLinearSolver", 1)) { return (1); }

  /* Initialize QUADRATURE(S). */
  retval = IDAQuadInit(mem, rhsQ, q);
  if (check_retval(&retval, "IDAQuadInit", 1)) { return (1); }

  /* Set tolerances and error control for quadratures. */
  retval = IDAQuadSStolerances(mem, RTOLQ, ATOLQ);
  if (check_retval(&retval, "IDAQuadSStolerances", 1)) { return (1); }

  retval = IDASetQuadErrCon(mem, SUNTRUE);
  if (check_retval(&retval, "IDASetQuadErrCon", 1)) { return (1); }

  /* Prepare ADJOINT. */
  retval = IDAAdjInit(mem, STEPS, IDA_HERMITE);
  if (check_retval(&retval, "IDAAdjInit", 1)) { return (1); }

  /* FORWARD run. */
  printf("Forward integration ... ");
  retval = IDASolveF(mem, TF, &time, yy, yp, IDA_NORMAL, &ncheck);
  if (check_retval(&retval, "IDASolveF", 1)) { return (1); }

  retval = IDAGetNumSteps(mem, &nst);
  if (check_retval(&retval, "IDAGetNumSteps", 1)) { return (1); }

  printf("done ( nst = %ld )\n", nst);

  retval = IDAGetQuad(mem, &time, q);
  if (check_retval(&retval, "IDAGetQuad", 1)) { return (1); }

#if defined(SUNDIALS_EXTENDED_PRECISION)
  printf("G:          %24.16Lf \n", Ith(q, 1));
#else
  printf("G:          %24.16f \n", Ith(q, 1));
#endif
  printf("--------------------------------------------------------\n\n");

  /* BACKWARD run */

  /* Initialize yB */
  yB = N_VClone(yy);
  if (check_retval((void*)yB, "N_VNew_Serial", 0)) { return (1); }
  N_VConst(ZERO, yB);

  ypB = N_VClone(yB);
  if (check_retval((void*)ypB, "N_VNew_Serial", 0)) { return (1); }
  N_VConst(ZERO, ypB);
  Ith(ypB, 1) = -ONE;

  retval = IDACreateB(mem, &indexB);
  if (check_retval(&retval, "IDACreateB", 1)) { return (1); }

  retval = IDAInitB(mem, indexB, resB, TF, yB, ypB);
  if (check_retval(&retval, "IDAInitB", 1)) { return (1); }

  retval = IDASStolerancesB(mem, indexB, RTOLB, ATOLB);
  if (check_retval(&retval, "IDASStolerancesB", 1)) { return (1); }

  retval = IDASetUserDataB(mem, indexB, data);
  if (check_retval(&retval, "IDASetUserDataB", 1)) { return (1); }

  retval = IDASetMaxNumStepsB(mem, indexB, 1000);

  /* Create dense SUNMatrix for use in linear solves */
  AB = SUNDenseMatrix(NEQ, NEQ, ctx);
  if (check_retval((void*)AB, "SUNDenseMatrix", 0)) { return (1); }

  /* Create dense SUNLinearSolver object */
  LSB = SUNLinSol_Dense(yB, AB, ctx);
  if (check_retval((void*)LSB, "SUNLinSol_Dense", 0)) { return (1); }

  /* Attach the matrix and linear solver */
  retval = IDASetLinearSolverB(mem, indexB, LSB, AB);
  if (check_retval(&retval, "IDASetLinearSolverB", 1)) { return (1); }

  printf("Backward integration ... ");

  retval = IDASolveB(mem, T0, IDA_NORMAL);
  if (check_retval(&retval, "IDASolveB", 1)) { return (1); }

  IDAGetNumSteps(IDAGetAdjIDABmem(mem, indexB), &nstB);
  printf("done ( nst = %ld )\n", nstB);

  retval = IDAGetB(mem, indexB, &time, yB, ypB);
  if (check_retval(&retval, "IDAGetB", 1)) { return (1); }

  PrintOutput(time, yB, ypB);

  IDAFree(&mem);
  SUNLinSolFree(LS);
  SUNMatDestroy(A);
  SUNLinSolFree(LSB);
  SUNMatDestroy(AB);
  N_VDestroy(yy);
  N_VDestroy(yp);
  N_VDestroy(yB);
  N_VDestroy(ypB);
  N_VDestroy(q);
  free(data);
  SUNContext_Free(&ctx);

  return (0);
}